

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.h
# Opt level: O0

void __thiscall Json::JsonParser::JsonParser(JsonParser *this,string *jsonText)

{
  string *jsonText_local;
  JsonParser *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->jsonValue);
  JsonReader::JsonReader(&this->__reader,jsonText);
  this->__escape = false;
  this->__parser = false;
  return;
}

Assistant:

explicit JsonParser(const std::string &jsonText) : __reader(jsonText) {}